

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O1

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_0::TypeMerging::mergeableSupertypesFirst
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          TypeMerging *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_38;
  code *pcStack_20;
  
  local_38.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcStack_20 = std::
               _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
               ::_M_invoke;
  local_38.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
                ::_M_manager;
  local_38.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  HeapTypeOrdering::supertypesFirst<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            (__return_storage_ptr__,(HeapTypeOrdering *)types,&local_38,
             (function<std::optional<wasm::HeapType>_(wasm::HeapType)> *)
             std::
             _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
             ::_M_manager);
  if (local_38.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)local_38.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&local_38,&local_38,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType>
  mergeableSupertypesFirst(const std::vector<HeapType>& types) {
    return HeapTypeOrdering::supertypesFirst(
      types, [&](HeapType type) -> std::optional<HeapType> {
        if (auto super = type.getDeclaredSuperType()) {
          return getMerged(*super);
        }
        return std::nullopt;
      });
  }